

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

vector<Range,_std::allocator<Range>_> *
subtractRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,
              vector<Range,_std::allocator<Range>_> *ranges,
              vector<Range,_std::allocator<Range>_> *subtractions)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  Range *split_range;
  pointer __x;
  pointer this;
  pointer other;
  vector<Range,_std::allocator<Range>_> split_results;
  vector<Range,_std::allocator<Range>_> local_60;
  vector<Range,_std::allocator<Range>_> local_48;
  
  std::vector<Range,_std::allocator<Range>_>::vector(__return_storage_ptr__,ranges);
  pRVar1 = (subtractions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (other = (subtractions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
               super__Vector_impl_data._M_start; other != pRVar1; other = other + 1) {
    local_48.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pRVar2 = (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
                super__Vector_impl_data._M_start; this != pRVar2; this = this + 1) {
      Range::subtract(&local_60,this,other);
      pRVar3 = local_60.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__x = local_60.super__Vector_base<Range,_std::allocator<Range>_>._M_impl.
                 super__Vector_impl_data._M_start; __x != pRVar3; __x = __x + 1) {
        std::vector<Range,_std::allocator<Range>_>::push_back(&local_48,__x);
      }
      std::vector<Range,_std::allocator<Range>_>::~vector(&local_60);
    }
    std::vector<Range,_std::allocator<Range>_>::operator=(__return_storage_ptr__,&local_48);
    std::vector<Range,_std::allocator<Range>_>::~vector(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> subtractRanges (
  const std::vector <Range>& ranges,
  const std::vector <Range>& subtractions)
{
  std::vector <Range> results = ranges;
  for (auto& s : subtractions)
  {
    std::vector <Range> split_results;
    for (auto& range : results)
      for (auto& split_range : range.subtract (s))
        split_results.push_back (split_range);

    results = split_results;
  }

  return results;
}